

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

node * make_simple_tree(float32 **means,float32 **vars,float32 ***mixw,int32 *nodephoneids,
                       int32 nphones,int32 ndensity,int32 nfeat,int32 ndim,int32 npermute,
                       int32 depth,int32 continuous)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float32 *pfVar4;
  float32 *pfVar5;
  float32 *pfVar6;
  float32 *pfVar7;
  int32 *piVar8;
  float32 *pfVar9;
  float32 *pfVar10;
  double dVar11;
  ulong uVar12;
  float32 **ppfVar13;
  float32 ***pppfVar14;
  node *pnVar15;
  int32 *piVar16;
  int32 **lists;
  cmd_ln_t *cmdln;
  node *pnVar17;
  uint nsets;
  int iVar18;
  long lVar19;
  size_t n_elem;
  ulong uVar20;
  float32 **pvars;
  long lVar21;
  long lVar22;
  ulong uVar23;
  int32 **ppiVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  float32 **ppfVar28;
  ulong uVar29;
  ulong uVar30;
  size_t d2;
  float fVar31;
  float32 fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  int32 npermute_00;
  float32 **local_d8;
  float32 **local_d0;
  float32 ***local_c0;
  int32 b;
  int32 a;
  float32 **local_b0;
  float32 **local_a8;
  int32 **local_a0;
  float32 **local_98;
  float32 ***local_90;
  float32 **local_88;
  float32 **local_80;
  ulong local_78;
  float32 ***local_70;
  float32 **local_68;
  float32 **local_60;
  int32 *local_58;
  int32 rnphones;
  int32 lnphones;
  node *local_48;
  int32 *rphoneids;
  int32 *lphoneids;
  
  uVar12 = (ulong)(uint)ndensity;
  local_80 = means;
  local_70 = mixw;
  local_68 = vars;
  pnVar15 = (node *)__ckd_calloc__(1,0x30,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,0x16b);
  n_elem = (size_t)nphones;
  piVar16 = (int32 *)__ckd_calloc__(n_elem,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x16c);
  pnVar15->phoneids = piVar16;
  pnVar15->nphones = nphones;
  local_58 = nodephoneids;
  memcpy(piVar16,nodephoneids,n_elem * 4);
  pnVar15->depth = depth;
  local_48 = pnVar15;
  local_c0 = (float32 ***)
             __ckd_calloc_3d__(n_elem,(long)nfeat,(long)ndensity,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                               ,0x172);
  local_90 = (float32 ***)
             __ckd_calloc_3d__(n_elem,(long)nfeat,(long)ndensity,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                               ,0x173);
  lists = (int32 **)
          __ckd_calloc_2d__(n_elem,n_elem,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                            ,0x174);
  local_98 = (float32 **)
             __ckd_calloc__(n_elem,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                            ,0x175);
  local_a0 = (int32 **)
             __ckd_calloc_2d__(n_elem,n_elem,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                               ,0x176);
  local_88 = (float32 **)
             __ckd_calloc__(n_elem,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                            ,0x177);
  if (continuous == 0) {
    fVar31 = 0.0;
    local_d8 = (float32 **)0x0;
    local_a8 = (float32 **)0x0;
    local_d0 = (float32 **)0x0;
    local_b0 = (float32 **)0x0;
  }
  else {
    cmdln = cmd_ln_get();
    dVar11 = cmd_ln_float_r(cmdln,"-varfloor");
    fVar31 = (float)dVar11;
    d2 = (size_t)ndim;
    local_b0 = (float32 **)
               __ckd_calloc_2d__(n_elem,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17b);
    local_d0 = (float32 **)
               __ckd_calloc_2d__(n_elem,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17c);
    local_a8 = (float32 **)
               __ckd_calloc_2d__(n_elem,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17d);
    local_d8 = (float32 **)
               __ckd_calloc_2d__(n_elem,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17e);
  }
  local_78 = (ulong)(uint)npermute;
  uVar29 = (ulong)(uint)nfeat;
  uVar20 = (ulong)(uint)ndim;
  if (0 < nphones) {
    uVar30 = 0;
    do {
      *(undefined4 *)((long)local_98 + uVar30 * 4) = 1;
      iVar18 = local_58[uVar30];
      *lists[uVar30] = iVar18;
      if (0 < nfeat) {
        uVar23 = 0;
        do {
          if (0 < ndensity) {
            pfVar4 = local_70[iVar18][uVar23];
            pfVar5 = local_c0[uVar30][uVar23];
            uVar27 = 0;
            do {
              pfVar5[uVar27] = pfVar4[uVar27];
              uVar27 = uVar27 + 1;
            } while (uVar12 != uVar27);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar29);
      }
      if (0 < ndim && continuous != 0) {
        pfVar4 = local_80[iVar18];
        pfVar5 = local_b0[uVar30];
        pfVar6 = local_68[iVar18];
        pfVar7 = local_d0[uVar30];
        uVar23 = 0;
        do {
          pfVar5[uVar23] = pfVar4[uVar23];
          pfVar7[uVar23] = pfVar6[uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar20 != uVar23);
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != (uint)nphones);
  }
  if (npermute < nphones) {
    local_58 = (int32 *)CONCAT71(local_58._1_7_,ndim < 1 || continuous == 0);
    ppiVar24 = lists;
    ppfVar28 = local_88;
    nsets = nphones;
    do {
      pvars = local_d0;
      pppfVar14 = local_90;
      ppfVar13 = local_98;
      lists = local_a0;
      local_60 = local_d8;
      local_88 = local_a8;
      local_a8 = local_b0;
      local_a0 = ppiVar24;
      local_98 = ppfVar28;
      local_90 = local_c0;
      findclosestpair(local_b0,pvars,local_c0,nsets,ndensity,nfeat,ndim,&a,&b,continuous);
      if ((int)nsets < 1) {
        lVar21 = 0;
      }
      else {
        uVar30 = 0;
        iVar18 = 0;
        do {
          if ((uVar30 != (uint)a) && (uVar30 != (uint)b)) {
            iVar3 = *(int *)((long)ppfVar13 + uVar30 * 4);
            lVar21 = (long)iVar18;
            *(int *)((long)local_98 + lVar21 * 4) = iVar3;
            if (0 < iVar3) {
              piVar16 = local_a0[uVar30];
              piVar8 = lists[lVar21];
              lVar26 = 0;
              do {
                piVar8[lVar26] = piVar16[lVar26];
                lVar26 = lVar26 + 1;
              } while (lVar26 < *(int *)((long)ppfVar13 + uVar30 * 4));
            }
            if (0 < nfeat) {
              uVar23 = 0;
              do {
                if (0 < ndensity) {
                  pfVar4 = local_90[uVar30][uVar23];
                  pfVar5 = pppfVar14[lVar21][uVar23];
                  uVar27 = 0;
                  do {
                    pfVar5[uVar27] = pfVar4[uVar27];
                    uVar27 = uVar27 + 1;
                  } while (uVar12 != uVar27);
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar29);
            }
            if ((char)local_58 == '\0') {
              pfVar4 = local_a8[uVar30];
              pfVar5 = local_88[lVar21];
              pfVar6 = pvars[uVar30];
              pfVar7 = local_60[lVar21];
              uVar23 = 0;
              do {
                pfVar5[uVar23] = pfVar4[uVar23];
                pfVar7[uVar23] = pfVar6[uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar20 != uVar23);
            }
            iVar18 = iVar18 + 1;
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != nsets);
        lVar21 = (long)iVar18;
      }
      *(int *)((long)local_98 + lVar21 * 4) =
           *(int *)((long)ppfVar13 + (long)b * 4) + *(int *)((long)ppfVar13 + (long)a * 4);
      lVar26 = (long)a;
      if (*(int *)((long)ppfVar13 + lVar26 * 4) < 1) {
        lVar22 = 0;
      }
      else {
        piVar16 = local_a0[lVar26];
        piVar8 = lists[lVar21];
        lVar22 = 0;
        do {
          piVar8[lVar22] = piVar16[lVar22];
          lVar22 = lVar22 + 1;
        } while (lVar22 < *(int *)((long)ppfVar13 + lVar26 * 4));
      }
      lVar19 = (long)b;
      if (0 < *(int *)((long)ppfVar13 + lVar19 * 4)) {
        piVar16 = local_a0[lVar19];
        piVar8 = lists[lVar21];
        lVar25 = 0;
        do {
          piVar8[lVar22 + lVar25] = piVar16[lVar25];
          lVar25 = lVar25 + 1;
        } while (lVar25 < *(int *)((long)ppfVar13 + lVar19 * 4));
      }
      if (continuous == 0) {
        if (0 < nfeat) {
          uVar30 = 0;
          do {
            if (0 < ndensity) {
              pfVar4 = local_90[lVar26][uVar30];
              pfVar5 = local_90[lVar19][uVar30];
              pfVar6 = pppfVar14[lVar21][uVar30];
              uVar23 = 0;
              do {
                pfVar6[uVar23] = (float32)((float)pfVar4[uVar23] + (float)pfVar5[uVar23]);
                uVar23 = uVar23 + 1;
              } while (uVar12 != uVar23);
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar29);
        }
      }
      else {
        pfVar4 = local_88[lVar21];
        pfVar5 = local_60[lVar21];
        pfVar6 = local_a8[lVar26];
        pfVar7 = pvars[lVar26];
        fVar1 = (float)**local_90[lVar26];
        fVar2 = (float)**local_90[lVar19];
        pfVar9 = local_a8[lVar19];
        pfVar10 = pvars[lVar19];
        fVar33 = fVar1 + fVar2;
        **pppfVar14[lVar21] = (float32)fVar33;
        if (0 < ndim) {
          uVar30 = 0;
          do {
            pfVar4[uVar30] =
                 (float32)(((float)pfVar6[uVar30] * fVar1 + (float)pfVar9[uVar30] * fVar2) / fVar33)
            ;
            fVar35 = (float)pfVar6[uVar30];
            fVar34 = (float)pfVar9[uVar30];
            fVar34 = (fVar35 * fVar35 + (float)pfVar7[uVar30]) * fVar1 +
                     (fVar34 * fVar34 + (float)pfVar10[uVar30]) * fVar2;
            pfVar5[uVar30] = (float32)fVar34;
            fVar35 = (float)pfVar4[uVar30];
            fVar34 = fVar34 / fVar33 - fVar35 * fVar35;
            fVar35 = fVar31;
            if (fVar31 <= fVar34) {
              fVar35 = fVar34;
            }
            pfVar5[uVar30] = (float32)fVar35;
            uVar30 = uVar30 + 1;
          } while (uVar20 != uVar30);
        }
      }
      nsets = nsets - 1;
      local_b0 = local_88;
      local_c0 = pppfVar14;
      local_d0 = local_60;
      ppiVar24 = lists;
      ppfVar28 = ppfVar13;
      local_d8 = pvars;
    } while (npermute < (int)nsets);
    local_d0 = local_60;
  }
  else {
    local_78 = (ulong)(uint)nphones;
  }
  ppfVar28 = local_b0;
  if (nphones < 2) {
    local_48->left = (node_str *)0x0;
    local_48->right = (node_str *)0x0;
    pnVar15 = local_48;
  }
  else {
    fVar32 = permute(local_80,local_68,local_70,ndensity,nfeat,ndim,lists,(int32 *)local_98,
                     (int32)local_78,&lphoneids,&rphoneids,&lnphones,&rnphones,continuous);
    pnVar15 = local_48;
    local_48->lkhd_dec = fVar32;
    if (continuous != 0) {
      ckd_free_2d(ppfVar28);
      ckd_free_2d(local_d0);
      ckd_free_2d(local_a8);
      ckd_free_2d(local_d8);
    }
    ckd_free_3d(local_c0);
    ckd_free_3d(local_90);
    ckd_free_2d(local_a0);
    ckd_free_2d(lists);
    ppfVar28 = local_68;
    pppfVar14 = local_70;
    npermute_00 = (int32)local_78;
    pnVar17 = make_simple_tree(local_80,local_68,local_70,lphoneids,lnphones,ndensity,nfeat,ndim,
                               npermute_00,pnVar15->depth + 1,continuous);
    pnVar15->left = pnVar17;
    pnVar17 = make_simple_tree(local_80,ppfVar28,pppfVar14,rphoneids,rnphones,ndensity,nfeat,ndim,
                               npermute_00,pnVar15->depth + 1,continuous);
    pnVar15->right = pnVar17;
  }
  return pnVar15;
}

Assistant:

node *make_simple_tree (float32 **means, float32 **vars, float32 ***mixw,
           int32 *nodephoneids, int32 nphones, int32 ndensity, 
           int32 nfeat, int32 ndim, int32 npermute, int32 depth, int32 continuous)
{
    float32  **oldmeans=NULL, **oldvars=NULL, **newmeans=NULL, **newvars=NULL;
    float32  ***oldmixw, ***newmixw, **tmp2d, ***tmp3d;
    float32  minvar=0, bestdec;
    int32    **phoneid, **newphoneid, *numphones, *newnumphones, **it2d, *it1d;
    int32    i,j,k,l,a,b,set,nsets;
    int32    *lphoneids,*rphoneids,lnphones,rnphones;
    node     *root;

    /* Allocate and set basic root parameters */
    root = (node *) ckd_calloc(1,sizeof(node));
    root->phoneids = (int32 *) ckd_calloc(nphones,sizeof(int32));
    root->nphones = nphones;
    memcpy(root->phoneids,nodephoneids,nphones*sizeof(int32));
    root->depth = depth;

    /* Build the node by clustering and partitioning */
    oldmixw = (float32***)ckd_calloc_3d(nphones,nfeat,ndensity,sizeof(float32));
    newmixw = (float32***)ckd_calloc_3d(nphones,nfeat,ndensity,sizeof(float32));
    phoneid = (int32 **)ckd_calloc_2d(nphones,nphones,sizeof(int32));
    numphones = (int32 *) ckd_calloc(nphones,sizeof(int32));
    newphoneid = (int32 **)ckd_calloc_2d(nphones,nphones,sizeof(int32));
    newnumphones = (int32 *) ckd_calloc(nphones,sizeof(int32));

    if (continuous) {
        minvar = cmd_ln_float32("-varfloor");
        oldmeans = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        oldvars = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        newmeans = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        newvars = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
    }

    for (i=0;i<nphones;i++){
        numphones[i] = 1;
        phoneid[i][0] =  nodephoneids[i]; /* Phone ids */
        for (j=0;j<nfeat;j++)
            for (k=0;k<ndensity;k++)
                oldmixw[i][j][k] = mixw[nodephoneids[i]][j][k];
        if (continuous) {
            for (l=0;l<ndim;l++){
                oldmeans[i][l] = means[nodephoneids[i]][l];
                oldvars[i][l] = vars[nodephoneids[i]][l];
            }
        }
    }
    if (nphones > npermute){

        for (nsets = nphones; nsets > npermute; nsets--) {
            /* Find the closest distributions */
            findclosestpair(oldmeans,oldvars,oldmixw,nsets,ndensity,
                                                         nfeat,ndim,&a,&b, continuous);

            /* Copy and Merge distributions... */
            /* Copy unmerged distributions first */
            for (i=0,set=0;i<nsets;i++){
                if (i != a && i != b){
                    newnumphones[set] = numphones[i];
                    for (l=0;l<numphones[i];l++)
                        newphoneid[set][l] = phoneid[i][l];
                    for (j=0;j<nfeat;j++)
                        for (k=0;k<ndensity;k++)
                            newmixw[set][j][k] = oldmixw[i][j][k];
                    if (continuous) {
                        for (l=0;l<ndim;l++){
                            newmeans[set][l] = oldmeans[i][l];
                            newvars[set][l] = oldvars[i][l];
                        }
                    }
                    set++;
                }
            }
            /* Merge a and b */
            newnumphones[set] =  numphones[a]+numphones[b];
            for (i=0;i<numphones[a];i++)
                newphoneid[set][i] = phoneid[a][i];
            for (l=0;l<numphones[b];l++,i++)
                newphoneid[set][i] = phoneid[b][l];
            if (continuous) {
                float32 *nm = newmeans[set];
                float32 *nv = newvars[set];
                float32 *oma = oldmeans[a];
                float32 *ova = oldvars[a];
                float32 *omb = oldmeans[b];
                float32 *ovb = oldvars[b];
                float32 cnta, cntb;

                cnta = oldmixw[a][0][0]; cntb = oldmixw[b][0][0];
                newmixw[set][0][0] = cnta + cntb;
                for (l=0;l<ndim;l++){
                    nm[l] = (cnta*oma[l] + cntb*omb[l]) / (cnta + cntb);
                    nv[l] = cnta*(ova[l]+oma[l]*oma[l]) +
                            cntb*(ovb[l]+omb[l]*omb[l]);
                    nv[l] = nv[l]/(cnta+cntb) - nm[l]*nm[l];
                    if (nv[l] < minvar) nv[l] = minvar;
                }
            }
            else {
                for (j=0;j<nfeat;j++)
                    for (k=0;k<ndensity;k++)
                        newmixw[set][j][k] = oldmixw[a][j][k]+oldmixw[b][j][k];
            }

            /* Switch old and new variables */
            tmp2d = oldmeans; oldmeans = newmeans; newmeans = tmp2d;
            tmp2d = oldvars;  oldvars = newvars;   newvars = tmp2d;
            tmp3d = oldmixw;  oldmixw = newmixw;   newmixw = tmp3d;
            it2d = phoneid;  phoneid = newphoneid; newphoneid = it2d;
            it1d = numphones; numphones = newnumphones; newnumphones = it1d;
        }
    }
    else npermute = nphones;

    if (nphones < 2){
        root->left = root->right = NULL; /* Dont split further */
        return(root);
    }

    bestdec = permute(means,vars,mixw,ndensity,nfeat,ndim,phoneid,numphones,
                      npermute,&lphoneids,&rphoneids,&lnphones,&rnphones, continuous);

    root->lkhd_dec = bestdec;

    if (continuous) {
        ckd_free_2d((void **)oldmeans); ckd_free_2d((void **)oldvars);
        ckd_free_2d((void **)newmeans); ckd_free_2d((void **)newvars);
    }
    ckd_free_3d((void ***)oldmixw); ckd_free_3d((void ***)newmixw);
    ckd_free_2d((void **)newphoneid); ckd_free_2d((void **)phoneid);

    /* Recurse */
    root->left = make_simple_tree(means,vars,mixw,lphoneids,lnphones,
              ndensity,nfeat,ndim,npermute,root->depth+1, continuous);
    root->right = make_simple_tree(means,vars,mixw,rphoneids,rnphones,
              ndensity,nfeat,ndim,npermute,root->depth+1, continuous);

    return(root);
}